

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

vector<CBlockHeader,_std::allocator<CBlockHeader>_> * __thiscall
HeadersSyncState::PopHeadersReadyForAcceptance
          (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__return_storage_ptr__,
          HeadersSyncState *this)

{
  deque<CompressedHeader,_std::allocator<CompressedHeader>_> *this_00;
  size_type sVar1;
  long in_FS_OFFSET;
  CBlockHeader local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_download_state == REDOWNLOAD) {
    this_00 = &this->m_redownloaded_headers;
    do {
      sVar1 = std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::size(this_00);
      if (sVar1 < 0x391e) {
        sVar1 = std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::size(this_00);
        if ((sVar1 == 0) || (this->m_process_all_remaining_headers != true)) break;
      }
      CompressedHeader::GetFullHeader
                (&local_80,
                 (this->m_redownloaded_headers).
                 super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur,&this->m_redownload_buffer_first_prev_hash);
      std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::emplace_back<CBlockHeader>
                (__return_storage_ptr__,&local_80);
      std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::pop_front(this_00);
      CBlockHeader::GetHash
                ((uint256 *)&local_80,
                 (__return_storage_ptr__->
                 super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      *(undefined8 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
           local_80.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_;
      *(undefined8 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
           local_80.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_;
      *(undefined8 *)
       (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems =
           local_80._0_8_;
      *(undefined8 *)
       ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
           local_80.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_;
    } while( true );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CBlockHeader> HeadersSyncState::PopHeadersReadyForAcceptance()
{
    std::vector<CBlockHeader> ret;

    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return ret;

    while (m_redownloaded_headers.size() > REDOWNLOAD_BUFFER_SIZE ||
            (m_redownloaded_headers.size() > 0 && m_process_all_remaining_headers)) {
        ret.emplace_back(m_redownloaded_headers.front().GetFullHeader(m_redownload_buffer_first_prev_hash));
        m_redownloaded_headers.pop_front();
        m_redownload_buffer_first_prev_hash = ret.back().GetHash();
    }
    return ret;
}